

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5Array::SetProperty
          (ES5Array *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags propertyOperationFlags,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  BOOL local_34 [2];
  BOOL result;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) ||
     (bVar1 = SetPropertyBuiltIns(this,local_48->pid,value,propertyOperationFlags,local_34), !bVar1)
     ) {
    local_34[0] = JavascriptArray::SetProperty
                            (&this->super_JavascriptArray,propertyNameString,value,
                             propertyOperationFlags,(PropertyValueInfo *)propertyRecord);
  }
  return local_34[0];
}

Assistant:

BOOL ES5Array::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags propertyOperationFlags, PropertyValueInfo* info)
    {
        BOOL result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), value, propertyOperationFlags, &result))
        {
            return result;
        }

        return __super::SetProperty(propertyNameString, value, propertyOperationFlags, info);
    }